

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
protozero::ScatteredStreamWriter::WriteBytesSlowPath
          (ScatteredStreamWriter *this,uint8_t *src,size_t size)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  ulong size_00;
  
  for (; size != 0; size = size - size_00) {
    puVar2 = (this->cur_range_).end;
    puVar1 = this->write_ptr_;
    if (puVar2 <= puVar1) {
      Extend(this);
      puVar2 = (this->cur_range_).end;
      puVar1 = this->write_ptr_;
    }
    size_00 = (long)puVar2 - (long)puVar1;
    if (size < (ulong)((long)puVar2 - (long)puVar1)) {
      size_00 = size;
    }
    WriteBytesUnsafe(this,src,size_00);
    src = src + size_00;
  }
  return;
}

Assistant:

void ScatteredStreamWriter::WriteBytesSlowPath(const uint8_t* src,
                                               size_t size) {
  size_t bytes_left = size;
  while (bytes_left > 0) {
    if (write_ptr_ >= cur_range_.end)
      Extend();
    const size_t burst_size = std::min(bytes_available(), bytes_left);
    WriteBytesUnsafe(src, burst_size);
    bytes_left -= burst_size;
    src += burst_size;
  }
}